

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

void __thiscall google::protobuf::DynamicMessage::~DynamicMessage(DynamicMessage *this)

{
  uint uVar1;
  Descriptor *pDVar2;
  long lVar3;
  long lVar4;
  TypeInfo *pTVar5;
  bool bVar6;
  Type TVar7;
  uint *puVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  Arena *pAVar12;
  FieldDescriptor *this_00;
  DynamicMessage *pDVar13;
  long i;
  RepeatedPtrFieldBase *this_01;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DynamicMessage_0070c830;
  pDVar2 = this->type_info_->type;
  internal::
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  ::~InternalMetadataWithArenaBase
            ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              *)((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                (long)this->type_info_->internal_metadata_offset));
  lVar11 = (long)this->type_info_->extensions_offset;
  if (lVar11 != -1) {
    internal::ExtensionSet::~ExtensionSet
              ((ExtensionSet *)
               ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + lVar11));
  }
  uVar10 = (ulong)*(uint *)(pDVar2 + 0x2c);
  if (0 < (int)*(uint *)(pDVar2 + 0x2c)) {
    lVar11 = 0;
    i = 0;
    do {
      lVar3 = *(long *)(pDVar2 + 0x30);
      this_00 = (FieldDescriptor *)(lVar3 + lVar11);
      lVar4 = *(long *)(lVar3 + 0x60 + lVar11);
      pTVar5 = this->type_info_;
      if (lVar4 == 0) {
        puVar8 = internal::scoped_array<unsigned_int>::operator[](&pTVar5->offsets,i);
        this_01 = (RepeatedPtrFieldBase *)
                  ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                  (long)(int)*puVar8);
        if (*(int *)(lVar3 + 0x4c + lVar11) == 3) {
          TVar7 = FieldDescriptor::type(this_00);
          switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar7 * 4)) {
          case 1:
          case 8:
            RepeatedField<int>::~RepeatedField((RepeatedField<int> *)this_01);
            break;
          case 2:
            RepeatedField<long>::~RepeatedField((RepeatedField<long> *)this_01);
            break;
          case 3:
            RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)this_01);
            break;
          case 4:
            RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)this_01);
            break;
          case 5:
            RepeatedField<double>::~RepeatedField((RepeatedField<double> *)this_01);
            break;
          case 6:
            RepeatedField<float>::~RepeatedField((RepeatedField<float> *)this_01);
            break;
          case 7:
            pAVar12 = *(Arena **)&this_01->current_size_;
            if ((pAVar12 != (Arena *)0x0) && (*(long *)pAVar12 == 0)) {
              uVar10 = (long)*(int *)((long)&this_01->arena_ + 4) + 8;
              goto LAB_005a3d4e;
            }
            break;
          case 9:
            internal::RepeatedPtrFieldBase::
            Destroy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(this_01);
            break;
          case 10:
            bVar6 = FieldDescriptor::is_map(this_00);
            if (bVar6) {
              (**(code **)this_01->arena_)(this_01);
            }
            else {
              internal::RepeatedPtrFieldBase::
              Destroy<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
                        (this_01);
            }
          }
        }
        else {
          TVar7 = FieldDescriptor::type(this_00);
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar7 * 4) == 9) {
            pDVar13 = this->type_info_->prototype;
            puVar8 = internal::scoped_array<unsigned_int>::operator[](&this->type_info_->offsets,i);
            uVar10 = (ulong)(int)*puVar8;
            pAVar12 = this_01->arena_;
            goto LAB_005a3d20;
          }
          TVar7 = FieldDescriptor::type(this_00);
          if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar7 * 4) == 10) &&
             (pDVar13 = this->type_info_->prototype,
             pDVar13 != (DynamicMessage *)0x0 && pDVar13 != this)) {
            pAVar12 = this_01->arena_;
            goto LAB_005a3db3;
          }
        }
      }
      else {
        iVar9 = (int)((ulong)(lVar4 - *(long *)(*(long *)(lVar4 + 0x10) + 0x40)) >> 4);
        if (*(int *)((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                    (long)(iVar9 * -0x55555554 + pTVar5->oneof_case_offset)) ==
            *(int *)(lVar3 + 0x38 + lVar11)) {
          puVar8 = internal::scoped_array<unsigned_int>::operator[]
                             (&pTVar5->offsets,(long)((int)uVar10 + iVar9 * -0x55555555));
          uVar1 = *puVar8;
          TVar7 = FieldDescriptor::type(this_00);
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar7 * 4) == 9) {
            pDVar13 = this->type_info_->prototype;
            puVar8 = internal::scoped_array<unsigned_int>::operator[](&this->type_info_->offsets,i);
            uVar10 = (ulong)*puVar8;
            pAVar12 = *(Arena **)
                       ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                       (long)(int)uVar1);
LAB_005a3d20:
            if (pAVar12 !=
                *(Arena **)
                 ((long)&(pDVar13->super_Message).super_MessageLite._vptr_MessageLite + uVar10)) {
              if (pAVar12 != (Arena *)0x0) {
                if (*(Arena **)pAVar12 != pAVar12 + 0x10) {
                  operator_delete(*(Arena **)pAVar12,*(long *)(pAVar12 + 0x10) + 1);
                }
              }
              uVar10 = 0x20;
LAB_005a3d4e:
              operator_delete(pAVar12,uVar10);
            }
          }
          else {
            TVar7 = FieldDescriptor::type(this_00);
            if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar7 * 4) == 10) {
              pAVar12 = *(Arena **)
                         ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                         (long)(int)uVar1);
LAB_005a3db3:
              if (pAVar12 != (Arena *)0x0) {
                (**(code **)(*(long *)pAVar12 + 8))();
              }
            }
          }
        }
      }
      i = i + 1;
      uVar10 = (ulong)*(int *)(pDVar2 + 0x2c);
      lVar11 = lVar11 + 0xa8;
    } while (i < (long)uVar10);
  }
  return;
}

Assistant:

DynamicMessage::~DynamicMessage() {
  const Descriptor* descriptor = type_info_->type;

  reinterpret_cast<InternalMetadataWithArena*>(
      OffsetToPointer(type_info_->internal_metadata_offset))
      ->~InternalMetadataWithArena();

  if (type_info_->extensions_offset != -1) {
    reinterpret_cast<ExtensionSet*>(
      OffsetToPointer(type_info_->extensions_offset))->~ExtensionSet();
  }

  // We need to manually run the destructors for repeated fields and strings,
  // just as we ran their constructors in the DynamicMessage constructor.
  // We also need to manually delete oneof fields if it is set and is string
  // or message.
  // Additionally, if any singular embedded messages have been allocated, we
  // need to delete them, UNLESS we are the prototype message of this type,
  // in which case any embedded messages are other prototypes and shouldn't
  // be touched.
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    if (field->containing_oneof()) {
      void* field_ptr = OffsetToPointer(
          type_info_->oneof_case_offset
          + sizeof(uint32) * field->containing_oneof()->index());
      if (*(reinterpret_cast<const uint32*>(field_ptr)) ==
          field->number()) {
        field_ptr = OffsetToPointer(type_info_->offsets[
            descriptor->field_count() + field->containing_oneof()->index()]);
        if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
          switch (field->options().ctype()) {
            default:
            case FieldOptions::STRING: {
              const ::std::string* default_value =
                  &(reinterpret_cast<const ArenaStringPtr*>(
                        reinterpret_cast<const uint8*>(
                            type_info_->prototype) +
                        type_info_->offsets[i])
                        ->Get());
              reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy(
                  default_value, NULL);
              break;
            }
          }
        } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            delete *reinterpret_cast<Message**>(field_ptr);
        }
      }
      continue;
    }
    void* field_ptr = OffsetToPointer(type_info_->offsets[i]);

    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
        case FieldDescriptor::CPPTYPE_##UPPERCASE :                           \
          reinterpret_cast<RepeatedField<LOWERCASE>*>(field_ptr)              \
              ->~RepeatedField<LOWERCASE>();                                  \
          break

        HANDLE_TYPE( INT32,  int32);
        HANDLE_TYPE( INT64,  int64);
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE( FLOAT,  float);
        HANDLE_TYPE(  BOOL,   bool);
        HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              reinterpret_cast<RepeatedPtrField<string>*>(field_ptr)
                  ->~RepeatedPtrField<string>();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (IsMapFieldInApi(field)) {
            reinterpret_cast<DynamicMapField*>(field_ptr)->~DynamicMapField();
          } else {
            reinterpret_cast<RepeatedPtrField<Message>*>(field_ptr)
                ->~RepeatedPtrField<Message>();
          }
          break;
      }

    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      switch (field->options().ctype()) {
        default:  // TODO(kenton):  Support other string reps.
        case FieldOptions::STRING: {
          const ::std::string* default_value =
              &(reinterpret_cast<const ArenaStringPtr*>(
                    type_info_->prototype->OffsetToPointer(
                        type_info_->offsets[i]))
                    ->Get());
          reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy(
              default_value, NULL);
          break;
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (!is_prototype()) {
        Message* message = *reinterpret_cast<Message**>(field_ptr);
        if (message != NULL) {
          delete message;
        }
      }
    }
  }
}